

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

void __thiscall capnp::PackedFdMessageReader::~PackedFdMessageReader(PackedFdMessageReader *this)

{
  PackedMessageReader::~PackedMessageReader(&this->super_PackedMessageReader);
  kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper
            (&this->super_BufferedInputStreamWrapper);
  kj::FdInputStream::~FdInputStream(&this->super_FdInputStream);
  return;
}

Assistant:

PackedFdMessageReader::~PackedFdMessageReader() noexcept(false) {}